

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O0

bool __thiscall QUrl::isParentOf(QUrl *this,QUrl *childUrl)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  qsizetype qVar6;
  qsizetype qVar7;
  QUrl *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QString ourPath;
  QString childPath;
  undefined4 in_stack_fffffffffffffe48;
  CaseSensitivity in_stack_fffffffffffffe4c;
  undefined4 in_stack_fffffffffffffe50;
  CaseSensitivity in_stack_fffffffffffffe54;
  undefined5 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5d;
  undefined2 in_stack_fffffffffffffe5e;
  QChar in_stack_fffffffffffffe6e;
  bool local_183;
  QUrl *in_stack_fffffffffffffe80;
  QFlagsStorage<QUrl::ComponentFormattingOption> in_stack_fffffffffffffe9c;
  bool local_151;
  QFlagsStorage<QUrl::ComponentFormattingOption> QVar8;
  bool local_115;
  QChar local_114;
  char16_t local_112;
  QChar local_110;
  QChar local_10e [75];
  QString local_78;
  QChar local_60;
  char16_t local_5e;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QFlags<QUrl::ComponentFormattingOption>::QFlags
            ((QFlags<QUrl::ComponentFormattingOption> *)
             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),in_stack_fffffffffffffe4c
            );
  path(in_stack_fffffffffffffe80,(ComponentFormattingOptions)in_stack_fffffffffffffe9c.i);
  if (*in_RDI == 0) {
    scheme((QUrl *)CONCAT26(in_stack_fffffffffffffe5e,
                            CONCAT15(in_stack_fffffffffffffe5d,in_stack_fffffffffffffe58)));
    QVar8.i = (Int)((ulong)in_RDI >> 0x20);
    bVar4 = QString::isEmpty((QString *)0x30022f);
    bVar1 = false;
    local_151 = false;
    if (bVar4) {
      QFlags<QUrl::ComponentFormattingOption>::QFlags
                ((QFlags<QUrl::ComponentFormattingOption> *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe4c);
      authority(in_stack_fffffffffffffe80,(ComponentFormattingOptions)QVar8.i);
      bVar1 = true;
      bVar4 = QString::isEmpty((QString *)0x300295);
      local_151 = false;
      if (bVar4) {
        qVar6 = QString::size(&local_20);
        local_151 = false;
        if (0 < qVar6) {
          local_5e = (char16_t)
                     QString::at((QString *)
                                 CONCAT26(in_stack_fffffffffffffe5e,
                                          CONCAT15(in_stack_fffffffffffffe5d,
                                                   in_stack_fffffffffffffe58)),
                                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
          QChar::QChar<char16_t,_true>(&local_60,L'/');
          local_151 = ::operator==((QChar *)CONCAT44(in_stack_fffffffffffffe54,
                                                     in_stack_fffffffffffffe50),
                                   (QChar *)CONCAT44(in_stack_fffffffffffffe4c,
                                                     in_stack_fffffffffffffe48));
        }
      }
    }
    local_115 = local_151;
    if (bVar1) {
      QString::~QString((QString *)0x300336);
    }
    QString::~QString((QString *)0x300343);
    goto LAB_00300880;
  }
  local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QFlags<QUrl::ComponentFormattingOption>::QFlags
            ((QFlags<QUrl::ComponentFormattingOption> *)
             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),in_stack_fffffffffffffe4c
            );
  QVar8.i = (Int)((ulong)in_RDI >> 0x20);
  path(in_stack_fffffffffffffe80,(ComponentFormattingOptions)in_stack_fffffffffffffe9c.i);
  scheme((QUrl *)CONCAT26(in_stack_fffffffffffffe5e,
                          CONCAT15(in_stack_fffffffffffffe5d,in_stack_fffffffffffffe58)));
  bVar5 = QString::isEmpty((QString *)0x30041f);
  bVar3 = false;
  bVar2 = false;
  bVar4 = false;
  bVar1 = false;
  if (bVar5) {
LAB_00300486:
    QFlags<QUrl::ComponentFormattingOption>::QFlags
              ((QFlags<QUrl::ComponentFormattingOption> *)
               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               in_stack_fffffffffffffe4c);
    authority(in_stack_fffffffffffffe80,(ComponentFormattingOptions)QVar8.i);
    bVar2 = true;
    bVar5 = QString::isEmpty((QString *)0x3004cf);
    if (!bVar5) {
      QFlags<QUrl::ComponentFormattingOption>::QFlags
                ((QFlags<QUrl::ComponentFormattingOption> *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe4c);
      authority(in_stack_fffffffffffffe80,(ComponentFormattingOptions)QVar8.i);
      bVar4 = true;
      QFlags<QUrl::ComponentFormattingOption>::QFlags
                ((QFlags<QUrl::ComponentFormattingOption> *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe4c);
      authority(in_RSI,(ComponentFormattingOptions)QVar8.i);
      bVar1 = true;
      bVar5 = ::operator==((QString *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                           (QString *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))
      ;
      local_115 = false;
      if (!bVar5) goto LAB_003006f4;
    }
    bVar5 = QString::startsWith((QString *)
                                CONCAT26(in_stack_fffffffffffffe5e,
                                         CONCAT15(in_stack_fffffffffffffe5d,
                                                  in_stack_fffffffffffffe58)),
                                (QString *)
                                CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                                in_stack_fffffffffffffe4c);
    local_115 = false;
    if (bVar5) {
      QChar::QChar<char16_t,_true>(local_10e,L'/');
      bVar5 = QString::endsWith((QString *)
                                CONCAT26(in_stack_fffffffffffffe5e,
                                         CONCAT15(in_stack_fffffffffffffe5d,
                                                  in_stack_fffffffffffffe58)),
                                in_stack_fffffffffffffe6e,in_stack_fffffffffffffe54);
      if (bVar5) {
        qVar6 = QString::size(&local_20);
        qVar7 = QString::size(&local_78);
        local_183 = true;
        local_115 = local_183;
        if (qVar7 < qVar6) goto LAB_003006f4;
      }
      QChar::QChar<char16_t,_true>(&local_110,L'/');
      bVar5 = QString::endsWith((QString *)
                                CONCAT26(in_stack_fffffffffffffe5e,
                                         CONCAT15(in_stack_fffffffffffffe5d,
                                                  in_stack_fffffffffffffe58)),
                                in_stack_fffffffffffffe6e,in_stack_fffffffffffffe54);
      local_115 = false;
      if (!bVar5) {
        qVar6 = QString::size(&local_20);
        qVar7 = QString::size(&local_78);
        local_115 = false;
        if (qVar7 < qVar6) {
          QString::size(&local_78);
          local_112 = (char16_t)
                      QString::at((QString *)
                                  CONCAT26(in_stack_fffffffffffffe5e,
                                           CONCAT15(in_stack_fffffffffffffe5d,
                                                    in_stack_fffffffffffffe58)),
                                  CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
          QChar::QChar<char16_t,_true>(&local_114,L'/');
          local_115 = ::operator==((QChar *)CONCAT44(in_stack_fffffffffffffe54,
                                                     in_stack_fffffffffffffe50),
                                   (QChar *)CONCAT44(in_stack_fffffffffffffe4c,
                                                     in_stack_fffffffffffffe48));
        }
      }
    }
  }
  else {
    scheme((QUrl *)CONCAT26(in_stack_fffffffffffffe5e,
                            CONCAT15(in_stack_fffffffffffffe5d,in_stack_fffffffffffffe58)));
    bVar3 = true;
    bVar5 = ::operator==((QString *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                         (QString *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    local_115 = false;
    if (bVar5) goto LAB_00300486;
  }
LAB_003006f4:
  if (bVar1) {
    QString::~QString((QString *)0x300717);
  }
  if (bVar4) {
    QString::~QString((QString *)0x30072d);
  }
  if (bVar2) {
    QString::~QString((QString *)0x300743);
  }
  if (bVar3) {
    QString::~QString((QString *)0x300759);
  }
  QString::~QString((QString *)0x300766);
  QString::~QString((QString *)0x30077b);
LAB_00300880:
  QString::~QString((QString *)0x30088d);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_115;
}

Assistant:

bool QUrl::isParentOf(const QUrl &childUrl) const
{
    QString childPath = childUrl.path();

    if (!d)
        return ((childUrl.scheme().isEmpty())
            && (childUrl.authority().isEmpty())
            && childPath.size() > 0 && childPath.at(0) == u'/');

    QString ourPath = path();

    return ((childUrl.scheme().isEmpty() || d->scheme == childUrl.scheme())
            && (childUrl.authority().isEmpty() || authority() == childUrl.authority())
            &&  childPath.startsWith(ourPath)
            && ((ourPath.endsWith(u'/') && childPath.size() > ourPath.size())
                || (!ourPath.endsWith(u'/') && childPath.size() > ourPath.size()
                    && childPath.at(ourPath.size()) == u'/')));
}